

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O0

bool __thiscall
QTreeModel::setHeaderData
          (QTreeModel *this,int section,Orientation orientation,QVariant *value,int role)

{
  int iVar1;
  undefined8 in_RCX;
  int in_EDX;
  int in_ESI;
  long *in_RDI;
  undefined4 in_R8D;
  long in_FS_OFFSET;
  bool local_21;
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_21 = true;
  if (((-1 < in_ESI) && (local_21 = true, in_EDX == 1)) && (local_21 = true, in_RDI[3] != 0)) {
    QModelIndex::QModelIndex((QModelIndex *)0x9101e5);
    iVar1 = (**(code **)(*in_RDI + 0x80))(in_RDI,local_20);
    local_21 = iVar1 <= in_ESI;
  }
  if (!local_21) {
    (**(code **)(*(long *)in_RDI[3] + 0x20))((long *)in_RDI[3],in_ESI,in_R8D,in_RCX);
  }
  local_21 = !local_21;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_21;
}

Assistant:

bool QTreeModel::setHeaderData(int section, Qt::Orientation orientation,
                               const QVariant &value, int role)
{
    if (section < 0 || orientation != Qt::Horizontal || !headerItem || section >= columnCount())
        return false;

    headerItem->setData(section, role, value);
    return true;
}